

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O0

bool Am_Do_Events(bool wait)

{
  Am_Time local_28;
  Am_Time local_20;
  Am_Time deadline;
  bool wait_local;
  
  am_Handle_Timing_Events();
  Am_Time::~Am_Time(&deadline);
  Am_Update_All();
  if (wait) {
    Am_Time::Now();
    Am_Time::operator+(&local_20,(unsigned_long)&local_28);
    Am_Time::~Am_Time(&local_28);
    Am_Drawonable::Process_Event(&local_20);
    Am_Time::~Am_Time(&local_20);
  }
  else {
    Am_Drawonable::Process_Immediate_Event();
  }
  Am_Update_All();
  return (bool)(Am_Main_Loop_Go & 1);
}

Assistant:

bool
Am_Do_Events(bool wait)
{
  am_Handle_Timing_Events();
  Am_Update_All();
  if (wait) {
    Am_Time deadline = Am_Time::Now() + 100UL; // 100 milliseconds from now
    Am_Drawonable::Process_Event(deadline);
  } else
    Am_Drawonable::Process_Immediate_Event();
  Am_Update_All();
  return Am_Main_Loop_Go;
}